

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O3

QSharedPointer<QObject> __thiscall
QtSharedPointer::sharedPointerFromVariant_internal(QtSharedPointer *this,QVariant *variant)

{
  PrivateShared *pPVar1;
  int *piVar2;
  Data *in_RDX;
  QSharedPointer<QObject> QVar3;
  
  if (((variant->d).field_0x18 & 1) != 0) {
    pPVar1 = (variant->d).data.shared;
    variant = (QVariant *)
              ((long)&(pPVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                      _q_value.super___atomic_base<int> + (long)pPVar1->offset);
  }
  *(PrivateShared **)this = (variant->d).data.shared;
  piVar2 = *(int **)((long)&(variant->d).data + 8);
  *(int **)(this + 8) = piVar2;
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + 1;
    UNLOCK();
    LOCK();
    *(int *)(*(long *)(this + 8) + 4) = *(int *)(*(long *)(this + 8) + 4) + 1;
    UNLOCK();
  }
  QVar3.d = in_RDX;
  QVar3.value.ptr = (QObject *)this;
  return QVar3;
}

Assistant:

QSharedPointer<QObject> QtSharedPointer::sharedPointerFromVariant_internal(const QVariant &variant)
{
    Q_ASSERT(variant.metaType().flags() & QMetaType::SharedPointerToQObject);
    return *reinterpret_cast<const QSharedPointer<QObject>*>(variant.constData());
}